

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperLib.c
# Opt level: O0

int Map_SuperLibDeriveFromGenlib(Mio_Library_t *pLib,int fVerbose)

{
  Vec_Str_t *vStr_00;
  char *pcVar1;
  Map_SuperLib_t *pLib_00;
  Map_SuperLib_t *p;
  char *pFileName;
  Vec_Str_t *vStr;
  Map_SuperLib_t *pLibSuper;
  int fVerbose_local;
  Mio_Library_t *pLib_local;
  
  if (pLib == (Mio_Library_t *)0x0) {
    pLib_local._4_4_ = 0;
  }
  else {
    vStr_00 = Super_PrecomputeStr(pLib,5,1,100000000,1e+07,1e+07,100,1,0);
    if (vStr_00 == (Vec_Str_t *)0x0) {
      pLib_local._4_4_ = 0;
    }
    else {
      pcVar1 = Mio_LibraryReadName(pLib);
      pcVar1 = Extra_FileNameGenericAppend(pcVar1,".super");
      pLib_00 = Map_SuperLibCreate(pLib,vStr_00,pcVar1,(char *)0x0,1,0);
      Vec_StrFree(vStr_00);
      p = (Map_SuperLib_t *)Abc_FrameReadLibSuper();
      Map_SuperLibFree(p);
      Abc_FrameSetLibSuper(pLib_00);
      pLib_local._4_4_ = 1;
    }
  }
  return pLib_local._4_4_;
}

Assistant:

int Map_SuperLibDeriveFromGenlib( Mio_Library_t * pLib, int fVerbose )
{
    Map_SuperLib_t * pLibSuper;
    Vec_Str_t * vStr;
    char * pFileName;
    if ( pLib == NULL )
        return 0;

    // compute supergates
    vStr = Super_PrecomputeStr( pLib, 5, 1, 100000000, 10000000, 10000000, 100, 1, 0 );
    if ( vStr == NULL )
        return 0;

    // create supergate library
    pFileName = Extra_FileNameGenericAppend( Mio_LibraryReadName(pLib), ".super" );
    pLibSuper = Map_SuperLibCreate( pLib, vStr, pFileName, NULL, 1, 0 );
    Vec_StrFree( vStr );

    // replace the library
    Map_SuperLibFree( (Map_SuperLib_t *)Abc_FrameReadLibSuper() );
    Abc_FrameSetLibSuper( pLibSuper );
    return 1;
}